

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.cc
# Opt level: O1

string * __thiscall
leveldb::test::RandomKey_abi_cxx11_(string *__return_storage_ptr__,test *this,Random *rnd,int len)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (0 < (int)rnd) {
    uVar4 = (ulong)rnd & 0xffffffff;
    do {
      uVar1 = (uint)((ulong)*(uint *)this * 0x41a7) & 0x7fffffff;
      iVar3 = (int)((ulong)*(uint *)this * 0x41a7 >> 0x1f);
      iVar2 = iVar3 + uVar1;
      iVar3 = iVar3 + uVar1 + -0x7fffffff;
      if (-1 < iVar2) {
        iVar3 = iVar2;
      }
      *(int *)this = iVar3;
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      uVar1 = (int)uVar4 - 1;
      uVar4 = (ulong)uVar1;
    } while (uVar1 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RandomKey(Random* rnd, int len) {
  // Make sure to generate a wide variety of characters so we
  // test the boundary conditions for short-key optimizations.
  static const char kTestChars[] = {'\0', '\1', 'a',    'b',    'c',
                                    'd',  'e',  '\xfd', '\xfe', '\xff'};
  std::string result;
  for (int i = 0; i < len; i++) {
    result += kTestChars[rnd->Uniform(sizeof(kTestChars))];
  }
  return result;
}